

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O1

void __thiscall
ExprWriterTest_ImplicationExprPrecedence_Test::~ExprWriterTest_ImplicationExprPrecedence_Test
          (ExprWriterTest_ImplicationExprPrecedence_Test *this)

{
  LogicalConstant *this_00;
  
  this_00 = &this[-1].super_ExprWriterTest.l0;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            ((BasicExprFactory<std::allocator<char>_> *)this);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, ImplicationExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  CHECK_WRITE("if 0 ==> 1 ==> 0 then 1",
      MakeIf(MakeImplication(MakeImplication(l0, l1, l0), l0, l0), n1, n0));
  CHECK_WRITE("if 0 ==> 1 ==> 0 else 1 then 1",
      MakeIf(MakeImplication(MakeImplication(l0, l1, l0), l0, l1), n1, n0));
  CHECK_WRITE("if 0 ==> 1 else 0 ==> 1 then 1",
      MakeIf(MakeImplication(l0, l1, MakeImplication(l0, l1, l0)), n1, n0));
  CHECK_WRITE("if 0 ==> (1 ==> 0) else 1 then 1",
      MakeIf(MakeImplication(l0, MakeImplication(l1, l0, l0), l1), n1, n0));
  CHECK_WRITE("if 0 ==> (1 ==> 0 else 1) then 1",
      MakeIf(MakeImplication(l0, MakeImplication(l1, l0, l1), l0), n1, n0));
  CHECK_WRITE("if 0 ==> 1 || 0 else 1 then 1",
              MakeIf(MakeImplication(
                       l0, MakeBinaryLogical(ex::OR, l1, l0), l1), n1, n0));
  CHECK_WRITE("if 0 ==> (1 <==> 0) else 1 then 1",
              MakeIf(MakeImplication(
                       l0, MakeBinaryLogical(ex::IFF, l1, l0), l1), n1, n0));
}